

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFScanningDecoder.cpp
# Opt level: O3

DecoderResult *
ZXing::Pdf417::ScanningDecoder::Decode
          (DecoderResult *__return_storage_ptr__,BitMatrix *image,
          Nullable<ZXing::ResultPoint> *imageTopLeft,Nullable<ZXing::ResultPoint> *imageBottomLeft,
          Nullable<ZXing::ResultPoint> *imageTopRight,Nullable<ZXing::ResultPoint> *imageBottomRight
          ,int minCodewordWidth,int maxCodewordWidth)

{
  undefined8 uVar1;
  pointer pNVar2;
  pointer pNVar3;
  RowIndicator rowIndicator;
  void *pvVar4;
  pointer pvVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  bool bVar8;
  bool bVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  vector<ZXing::Nullable<ZXing::Pdf417::DetectionResultColumn>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::DetectionResultColumn>_>_>
  *pvVar13;
  uint uVar14;
  int iVar15;
  long lVar16;
  long lVar17;
  ulong uVar18;
  int iVar19;
  pointer pvVar20;
  pointer *ppiVar21;
  vector<ZXing::Pdf417::BarcodeValue,_std::allocator<ZXing::Pdf417::BarcodeValue>_> *row;
  pointer this;
  pointer pNVar22;
  ulong uVar23;
  uint uVar24;
  BoundingBox *pBVar25;
  DetectionResultColumn *pDVar26;
  DetectionResultColumn *pDVar27;
  undefined8 *puVar28;
  size_type __n;
  BoundingBox *pBVar29;
  DetectionResultColumn *pDVar30;
  pointer pNVar31;
  undefined1 auVar32 [8];
  Nullable<ZXing::Pdf417::Codeword> *codeword_1;
  uint uVar33;
  long lVar34;
  byte bVar35;
  ResultPoint RVar36;
  int offset;
  BarcodeMetadata barcodeMetadata;
  vector<int,_std::allocator<int>_> ambiguousIndexesList;
  vector<int,_std::allocator<int>_> erasures;
  BarcodeMetadata leftBarcodeMetadata;
  vector<std::vector<ZXing::Pdf417::BarcodeValue,_std::allocator<ZXing::Pdf417::BarcodeValue>_>,_std::allocator<std::vector<ZXing::Pdf417::BarcodeValue,_std::allocator<ZXing::Pdf417::BarcodeValue>_>_>_>
  barcodeMatrix;
  vector<int,_std::allocator<int>_> codewords;
  Nullable<ZXing::Pdf417::BoundingBox> rightBox;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ambiguousIndexValues;
  DetectionResult detectionResult;
  BoundingBox boundingBox;
  int local_58c;
  vector<int,_std::allocator<int>_> local_578;
  void *local_558;
  iterator iStack_550;
  int *local_548;
  void *local_538;
  iterator iStack_530;
  int *local_528;
  BitMatrix *local_520;
  undefined1 local_518 [12];
  int iStack_50c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_508;
  pointer local_4f8;
  short local_4f0;
  Type TStack_4ee;
  undefined5 uStack_4ed;
  _Alloc_hider local_4e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4d0 [2];
  _Alloc_hider local_4b0;
  undefined1 local_4a0 [16];
  pointer local_490;
  _Alloc_hider local_488;
  RowIndicator local_480;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_478;
  Type local_45e;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_450;
  vector<std::vector<ZXing::Pdf417::BarcodeValue,_std::allocator<ZXing::Pdf417::BarcodeValue>_>,_std::allocator<std::vector<ZXing::Pdf417::BarcodeValue,_std::allocator<ZXing::Pdf417::BarcodeValue>_>_>_>
  local_440;
  ulong local_428;
  vector<int,_std::allocator<int>_> local_420;
  undefined1 local_408 [8];
  undefined8 uStack_400;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3f8;
  char *local_3e8;
  short local_3e0;
  Type local_3de;
  pointer local_390;
  pointer pNStack_388;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_380;
  RowIndicator local_378;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_368;
  long local_348;
  long local_340;
  ulong local_338;
  ulong local_330;
  DetectionResult local_328;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_280;
  double dStack_278;
  uint local_270;
  Nullable<ZXing::Pdf417::DetectionResultColumn> local_268;
  Nullable<ZXing::Pdf417::DetectionResultColumn> local_1c8;
  BoundingBox local_128;
  Nullable<ZXing::ResultPoint> *local_b0;
  BoundingBox local_a8;
  
  bVar35 = 0;
  BoundingBox::BoundingBox(&local_128);
  local_520 = image;
  bVar8 = BoundingBox::Create(image->_width,image->_height,imageTopLeft,imageBottomLeft,
                              imageTopRight,imageBottomRight,&local_128);
  if (!bVar8) {
    memset(__return_storage_ptr__,0,0xd0);
    DecoderResult::DecoderResult(__return_storage_ptr__);
    return __return_storage_ptr__;
  }
  local_268.m_hasValue = false;
  BoundingBox::BoundingBox(&local_268.m_value._boundingBox);
  local_268.m_value._codewords.
  super__Vector_base<ZXing::Nullable<ZXing::Pdf417::Codeword>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::Codeword>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  local_268.m_value._codewords.
  super__Vector_base<ZXing::Nullable<ZXing::Pdf417::Codeword>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::Codeword>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  local_268.m_value._rowIndicator = None;
  local_268.m_value._codewords.
  super__Vector_base<ZXing::Nullable<ZXing::Pdf417::Codeword>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::Codeword>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_268.m_value._codewords.
  super__Vector_base<ZXing::Nullable<ZXing::Pdf417::Codeword>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::Codeword>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
  local_268.m_value._codewords.
  super__Vector_base<ZXing::Nullable<ZXing::Pdf417::Codeword>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::Codeword>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
  pDVar27 = &local_1c8.m_value;
  local_1c8.m_hasValue = false;
  BoundingBox::BoundingBox(&pDVar27->_boundingBox);
  local_1c8.m_value._codewords.
  super__Vector_base<ZXing::Nullable<ZXing::Pdf417::Codeword>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::Codeword>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  local_1c8.m_value._codewords.
  super__Vector_base<ZXing::Nullable<ZXing::Pdf417::Codeword>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::Codeword>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  local_1c8.m_value._rowIndicator = None;
  local_1c8.m_value._codewords.
  super__Vector_base<ZXing::Nullable<ZXing::Pdf417::Codeword>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::Codeword>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1c8.m_value._codewords.
  super__Vector_base<ZXing::Nullable<ZXing::Pdf417::Codeword>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::Codeword>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
  local_1c8.m_value._codewords.
  super__Vector_base<ZXing::Nullable<ZXing::Pdf417::Codeword>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::Codeword>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
  DetectionResult::DetectionResult(&local_328);
  local_58c = minCodewordWidth;
  bVar8 = true;
  do {
    if (imageTopLeft->m_hasValue != false) {
      RVar36 = Nullable::operator_cast_to_ResultPoint((Nullable *)imageTopLeft);
      uStack_400 = RVar36.super_PointF.y;
      local_408 = (undefined1  [8])RVar36.super_PointF.x;
      GetRowIndicatorColumn
                ((DetectionResultColumn *)local_518,local_520,&local_128,(ResultPoint *)local_408,
                 true,minCodewordWidth,maxCodewordWidth);
      local_268.m_hasValue = true;
      pDVar26 = (DetectionResultColumn *)local_518;
      pDVar30 = &local_268.m_value;
      for (lVar16 = 0xf;
          pNVar31 = local_268.m_value._codewords.
                    super__Vector_base<ZXing::Nullable<ZXing::Pdf417::Codeword>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::Codeword>_>_>
                    ._M_impl.super__Vector_impl_data._M_start, lVar16 != 0; lVar16 = lVar16 + -1) {
        iVar12 = (pDVar26->_boundingBox)._imgHeight;
        (pDVar30->_boundingBox)._imgWidth = (pDVar26->_boundingBox)._imgWidth;
        (pDVar30->_boundingBox)._imgHeight = iVar12;
        pDVar26 = (DetectionResultColumn *)((long)pDVar26 + (ulong)bVar35 * -0x10 + 8);
        pDVar30 = (DetectionResultColumn *)((long)pDVar30 + ((ulong)bVar35 * -2 + 1) * 8);
      }
      lVar16 = CONCAT44(local_268.m_value._codewords.
                        super__Vector_base<ZXing::Nullable<ZXing::Pdf417::Codeword>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::Codeword>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                        local_268.m_value._codewords.
                        super__Vector_base<ZXing::Nullable<ZXing::Pdf417::Codeword>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::Codeword>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_);
      local_268.m_value._codewords.
      super__Vector_base<ZXing::Nullable<ZXing::Pdf417::Codeword>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::Codeword>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)local_4a0._0_8_;
      local_268.m_value._codewords.
      super__Vector_base<ZXing::Nullable<ZXing::Pdf417::Codeword>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::Codeword>_>_>
      ._M_impl.super__Vector_impl_data._M_finish._0_4_ = (undefined4)local_4a0._8_8_;
      local_268.m_value._codewords.
      super__Vector_base<ZXing::Nullable<ZXing::Pdf417::Codeword>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::Codeword>_>_>
      ._M_impl.super__Vector_impl_data._M_finish._4_4_ = SUB84(local_4a0._8_8_,4);
      local_268.m_value._codewords.
      super__Vector_base<ZXing::Nullable<ZXing::Pdf417::Codeword>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::Codeword>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = SUB84(local_490,0);
      local_268.m_value._codewords.
      super__Vector_base<ZXing::Nullable<ZXing::Pdf417::Codeword>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::Codeword>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
           (undefined4)((ulong)local_490 >> 0x20);
      local_4a0._0_8_ = (pointer)0x0;
      local_4a0._8_8_ = (pointer)0x0;
      local_490 = (pointer)0x0;
      if (pNVar31 == (pointer)0x0) {
        local_268.m_value._rowIndicator = (RowIndicator)local_488._M_p;
      }
      else {
        operator_delete(pNVar31,lVar16 - (long)pNVar31);
        local_268.m_value._rowIndicator = (RowIndicator)local_488._M_p;
        if ((pointer)local_4a0._0_8_ != (pointer)0x0) {
          operator_delete((void *)local_4a0._0_8_,(long)local_490 - local_4a0._0_8_);
        }
      }
    }
    if (imageTopRight->m_hasValue == true) {
      RVar36 = Nullable::operator_cast_to_ResultPoint((Nullable *)imageTopRight);
      uStack_400 = RVar36.super_PointF.y;
      local_408 = (undefined1  [8])RVar36.super_PointF.x;
      GetRowIndicatorColumn
                ((DetectionResultColumn *)local_518,local_520,&local_128,(ResultPoint *)local_408,
                 false,minCodewordWidth,maxCodewordWidth);
      local_1c8.m_hasValue = true;
      pDVar26 = (DetectionResultColumn *)local_518;
      pDVar30 = pDVar27;
      for (lVar16 = 0xf;
          pNVar31 = local_1c8.m_value._codewords.
                    super__Vector_base<ZXing::Nullable<ZXing::Pdf417::Codeword>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::Codeword>_>_>
                    ._M_impl.super__Vector_impl_data._M_start, lVar16 != 0; lVar16 = lVar16 + -1) {
        iVar12 = (pDVar26->_boundingBox)._imgHeight;
        (pDVar30->_boundingBox)._imgWidth = (pDVar26->_boundingBox)._imgWidth;
        (pDVar30->_boundingBox)._imgHeight = iVar12;
        pDVar26 = (DetectionResultColumn *)((long)pDVar26 + (ulong)bVar35 * -0x10 + 8);
        pDVar30 = (DetectionResultColumn *)((long)pDVar30 + (ulong)bVar35 * -0x10 + 8);
      }
      lVar16 = CONCAT44(local_1c8.m_value._codewords.
                        super__Vector_base<ZXing::Nullable<ZXing::Pdf417::Codeword>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::Codeword>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                        local_1c8.m_value._codewords.
                        super__Vector_base<ZXing::Nullable<ZXing::Pdf417::Codeword>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::Codeword>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_);
      local_1c8.m_value._codewords.
      super__Vector_base<ZXing::Nullable<ZXing::Pdf417::Codeword>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::Codeword>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)local_4a0._0_8_;
      local_1c8.m_value._codewords.
      super__Vector_base<ZXing::Nullable<ZXing::Pdf417::Codeword>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::Codeword>_>_>
      ._M_impl.super__Vector_impl_data._M_finish._0_4_ = (undefined4)local_4a0._8_8_;
      local_1c8.m_value._codewords.
      super__Vector_base<ZXing::Nullable<ZXing::Pdf417::Codeword>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::Codeword>_>_>
      ._M_impl.super__Vector_impl_data._M_finish._4_4_ = SUB84(local_4a0._8_8_,4);
      local_1c8.m_value._codewords.
      super__Vector_base<ZXing::Nullable<ZXing::Pdf417::Codeword>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::Codeword>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = SUB84(local_490,0);
      local_1c8.m_value._codewords.
      super__Vector_base<ZXing::Nullable<ZXing::Pdf417::Codeword>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::Codeword>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
           (undefined4)((ulong)local_490 >> 0x20);
      local_4a0._0_8_ = (pointer)0x0;
      local_4a0._8_8_ = (pointer)0x0;
      local_490 = (pointer)0x0;
      if (pNVar31 == (pointer)0x0) {
        local_1c8.m_value._rowIndicator = (RowIndicator)local_488._M_p;
      }
      else {
        operator_delete(pNVar31,lVar16 - (long)pNVar31);
        local_1c8.m_value._rowIndicator = (RowIndicator)local_488._M_p;
        if ((pointer)local_4a0._0_8_ != (pointer)0x0) {
          operator_delete((void *)local_4a0._0_8_,(long)local_490 - local_4a0._0_8_);
        }
      }
    }
    if (local_268.m_hasValue == false) {
      if (local_1c8.m_hasValue == true) {
        local_578.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        local_578.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        local_518._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        stack0xfffffffffffffaf0 =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        goto LAB_00178928;
      }
LAB_00178a6c:
      memset(__return_storage_ptr__,0,0xd0);
      DecoderResult::DecoderResult(__return_storage_ptr__);
      goto LAB_00179839;
    }
    local_578.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    local_578.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_518._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0;
    stack0xfffffffffffffaf0 =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0;
    bVar9 = DetectionResultColumn::getBarcodeMetadata
                      (&local_268.m_value,(BarcodeMetadata *)local_518);
    if (bVar9) {
      local_408 = (undefined1  [8])0x0;
      uStack_400 = 0.0;
      if (((local_1c8.m_hasValue & 1U) != 0) &&
         (bVar9 = DetectionResultColumn::getBarcodeMetadata(pDVar27,(BarcodeMetadata *)local_408),
         bVar9)) {
        if (local_518._0_4_ != local_408._0_4_) {
          if (local_518._4_4_ != local_408._4_4_) {
            if (iStack_50c + local_518._8_4_ != uStack_400._4_4_ + (int)uStack_400)
            goto LAB_00178a6c;
          }
        }
      }
      local_578.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)local_518._0_8_;
      local_578.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)stack0xfffffffffffffaf0;
    }
    else {
LAB_00178928:
      if (((local_1c8.m_hasValue & 1U) == 0) ||
         (bVar9 = DetectionResultColumn::getBarcodeMetadata(pDVar27,(BarcodeMetadata *)&local_578),
         !bVar9)) goto LAB_00178a6c;
    }
    local_518._0_8_ = local_518._0_8_ & 0xffffffffffffff00;
    BoundingBox::BoundingBox((BoundingBox *)(local_518 + 8));
    local_408 = (undefined1  [8])((ulong)local_408 & 0xffffffffffffff00);
    BoundingBox::BoundingBox((BoundingBox *)&uStack_400);
    local_b0 = (Nullable<ZXing::ResultPoint> *)((ulong)local_b0 & 0xffffffffffffff00);
    BoundingBox::BoundingBox(&local_a8);
    bVar9 = AdjustBoundingBox(&local_268,(Nullable<ZXing::Pdf417::BoundingBox> *)local_518);
    if (((!bVar9) ||
        (bVar9 = AdjustBoundingBox(&local_1c8,(Nullable<ZXing::Pdf417::BoundingBox> *)local_408),
        !bVar9)) ||
       (bVar9 = BoundingBox::Merge((Nullable<ZXing::Pdf417::BoundingBox> *)local_518,
                                   (Nullable<ZXing::Pdf417::BoundingBox> *)local_408,
                                   (Nullable<ZXing::Pdf417::BoundingBox> *)&local_b0), !bVar9))
    goto LAB_00178a6c;
    DetectionResult::init(&local_328,(EVP_PKEY_CTX *)&local_578);
    pNVar22 = local_328._detectionResultColumns.
              super__Vector_base<ZXing::Nullable<ZXing::Pdf417::DetectionResultColumn>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::DetectionResultColumn>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    iVar12 = local_328._barcodeMetadata._columnCount;
    if (((!bVar8) || (local_328._boundingBox.m_hasValue != true)) ||
       ((local_128._minY <= local_328._boundingBox.m_value._minY &&
        (local_328._boundingBox.m_value._maxY <= local_128._maxY)))) break;
    Nullable::operator_cast_to_BoundingBox
              ((BoundingBox *)local_518,(Nullable *)&local_328._boundingBox);
    pDVar26 = (DetectionResultColumn *)local_518;
    pBVar25 = &local_128;
    for (lVar16 = 0xf; lVar16 != 0; lVar16 = lVar16 + -1) {
      iVar12 = (pDVar26->_boundingBox)._imgHeight;
      pBVar25->_imgWidth = (pDVar26->_boundingBox)._imgWidth;
      pBVar25->_imgHeight = iVar12;
      pDVar26 = (DetectionResultColumn *)((long)pDVar26 + (ulong)bVar35 * -0x10 + 8);
      pBVar25 = (BoundingBox *)((long)pBVar25 + ((ulong)bVar35 * -2 + 1) * 8);
    }
    bVar8 = false;
  } while( true );
  local_328._boundingBox.m_hasValue = true;
  pBVar25 = &local_128;
  pBVar29 = &local_328._boundingBox.m_value;
  for (lVar16 = 0xf; lVar16 != 0; lVar16 = lVar16 + -1) {
    iVar11 = pBVar25->_imgHeight;
    pBVar29->_imgWidth = pBVar25->_imgWidth;
    pBVar29->_imgHeight = iVar11;
    pBVar25 = (BoundingBox *)((long)pBVar25 + ((ulong)bVar35 * -2 + 1) * 8);
    pBVar29 = (BoundingBox *)((long)pBVar29 + ((ulong)bVar35 * -2 + 1) * 8);
  }
  lVar16 = (long)local_328._barcodeMetadata._columnCount;
  (local_328._detectionResultColumns.
   super__Vector_base<ZXing::Nullable<ZXing::Pdf417::DetectionResultColumn>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::DetectionResultColumn>_>_>
   ._M_impl.super__Vector_impl_data._M_start)->m_hasValue = local_268.m_hasValue;
  pDVar26 = &local_268.m_value;
  pDVar30 = &(local_328._detectionResultColumns.
              super__Vector_base<ZXing::Nullable<ZXing::Pdf417::DetectionResultColumn>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::DetectionResultColumn>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->m_value;
  for (lVar17 = 0xf; lVar17 != 0; lVar17 = lVar17 + -1) {
    iVar11 = (pDVar26->_boundingBox)._imgHeight;
    (pDVar30->_boundingBox)._imgWidth = (pDVar26->_boundingBox)._imgWidth;
    (pDVar30->_boundingBox)._imgHeight = iVar11;
    pDVar26 = (DetectionResultColumn *)((long)pDVar26 + ((ulong)bVar35 * -2 + 1) * 8);
    pDVar30 = (DetectionResultColumn *)((long)pDVar30 + (ulong)bVar35 * -0x10 + 8);
  }
  std::
  vector<ZXing::Nullable<ZXing::Pdf417::Codeword>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::Codeword>_>_>
  ::operator=(&((local_328._detectionResultColumns.
                 super__Vector_base<ZXing::Nullable<ZXing::Pdf417::DetectionResultColumn>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::DetectionResultColumn>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->m_value)._codewords,
              &local_268.m_value._codewords);
  pNVar2 = local_328._detectionResultColumns.
           super__Vector_base<ZXing::Nullable<ZXing::Pdf417::DetectionResultColumn>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::DetectionResultColumn>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar16 = lVar16 + 1;
  (pNVar22->m_value)._rowIndicator = local_268.m_value._rowIndicator;
  local_328._detectionResultColumns.
  super__Vector_base<ZXing::Nullable<ZXing::Pdf417::DetectionResultColumn>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::DetectionResultColumn>_>_>
  ._M_impl.super__Vector_impl_data._M_start[lVar16].m_hasValue = local_1c8.m_hasValue;
  pDVar26 = &local_328._detectionResultColumns.
             super__Vector_base<ZXing::Nullable<ZXing::Pdf417::DetectionResultColumn>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::DetectionResultColumn>_>_>
             ._M_impl.super__Vector_impl_data._M_start[lVar16].m_value;
  for (lVar17 = 0xf; lVar17 != 0; lVar17 = lVar17 + -1) {
    iVar11 = (pDVar27->_boundingBox)._imgHeight;
    (pDVar26->_boundingBox)._imgWidth = (pDVar27->_boundingBox)._imgWidth;
    (pDVar26->_boundingBox)._imgHeight = iVar11;
    pDVar27 = (DetectionResultColumn *)((long)pDVar27 + (ulong)bVar35 * -0x10 + 8);
    pDVar26 = (DetectionResultColumn *)((long)pDVar26 + (ulong)bVar35 * -0x10 + 8);
  }
  std::
  vector<ZXing::Nullable<ZXing::Pdf417::Codeword>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::Codeword>_>_>
  ::operator=(&local_328._detectionResultColumns.
               super__Vector_base<ZXing::Nullable<ZXing::Pdf417::DetectionResultColumn>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::DetectionResultColumn>_>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar16].m_value._codewords,
              &local_1c8.m_value._codewords);
  bVar8 = local_268.m_hasValue;
  pNVar2[lVar16].m_value._rowIndicator = local_1c8.m_value._rowIndicator;
  if (-1 < iVar12) {
    local_428 = (ulong)local_268.m_hasValue;
    uVar14 = local_268.m_hasValue - 1 | 1;
    local_348 = local_428 * 4 + 4;
    local_338 = (ulong)(iVar12 + 1);
    uVar23 = 1;
    local_340 = lVar16;
    do {
      iVar12 = (int)local_340 - (int)uVar23;
      if (bVar8 != false) {
        iVar12 = (int)uVar23;
      }
      local_330 = uVar23;
      if (local_328._detectionResultColumns.
          super__Vector_base<ZXing::Nullable<ZXing::Pdf417::DetectionResultColumn>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::DetectionResultColumn>_>_>
          ._M_impl.super__Vector_impl_data._M_start[iVar12].m_hasValue == false) {
        rowIndicator = (uint)(iVar12 == (int)local_340) * 2;
        if (iVar12 == 0) {
          rowIndicator = Left;
        }
        DetectionResultColumn::DetectionResultColumn
                  ((DetectionResultColumn *)local_408,&local_128,rowIndicator);
        local_518[0] = (allocator_type)0x1;
        pDVar27 = (DetectionResultColumn *)local_408;
        puVar28 = (undefined8 *)(local_518 + 8);
        for (lVar16 = 0xf;
            pNVar22 = local_328._detectionResultColumns.
                      super__Vector_base<ZXing::Nullable<ZXing::Pdf417::DetectionResultColumn>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::DetectionResultColumn>_>_>
                      ._M_impl.super__Vector_impl_data._M_start, lVar16 != 0; lVar16 = lVar16 + -1)
        {
          *puVar28 = *(undefined8 *)&pDVar27->_boundingBox;
          pDVar27 = (DetectionResultColumn *)((long)pDVar27 + (ulong)bVar35 * -0x10 + 8);
          puVar28 = puVar28 + (ulong)bVar35 * -2 + 1;
        }
        local_4a0._8_8_ = local_390;
        local_490 = pNStack_388;
        local_488._M_p = (pointer)local_380;
        local_390 = (pointer)0x0;
        pNStack_388 = (pointer)0x0;
        local_380 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0;
        local_480 = local_378;
        local_328._detectionResultColumns.
        super__Vector_base<ZXing::Nullable<ZXing::Pdf417::DetectionResultColumn>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::DetectionResultColumn>_>_>
        ._M_impl.super__Vector_impl_data._M_start[iVar12].m_hasValue = true;
        puVar28 = (undefined8 *)(local_518 + 8);
        pDVar27 = &local_328._detectionResultColumns.
                   super__Vector_base<ZXing::Nullable<ZXing::Pdf417::DetectionResultColumn>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::DetectionResultColumn>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[iVar12].m_value;
        for (lVar16 = 0xf; lVar16 != 0; lVar16 = lVar16 + -1) {
          uVar1 = *puVar28;
          (pDVar27->_boundingBox)._imgWidth = (int)uVar1;
          (pDVar27->_boundingBox)._imgHeight = (int)((ulong)uVar1 >> 0x20);
          puVar28 = puVar28 + (ulong)bVar35 * -2 + 1;
          pDVar27 = (DetectionResultColumn *)((long)pDVar27 + (ulong)bVar35 * -0x10 + 8);
        }
        std::
        vector<ZXing::Nullable<ZXing::Pdf417::Codeword>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::Codeword>_>_>
        ::operator=(&local_328._detectionResultColumns.
                     super__Vector_base<ZXing::Nullable<ZXing::Pdf417::DetectionResultColumn>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::DetectionResultColumn>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[iVar12].m_value._codewords,
                    (vector<ZXing::Nullable<ZXing::Pdf417::Codeword>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::Codeword>_>_>
                     *)(local_4a0 + 8));
        pNVar22[iVar12].m_value._rowIndicator = local_480;
        if ((pointer)local_4a0._8_8_ != (pointer)0x0) {
          operator_delete((void *)local_4a0._8_8_,(long)local_488._M_p - local_4a0._8_8_);
        }
        if (local_390 != (pointer)0x0) {
          operator_delete(local_390,(long)local_380 - (long)local_390);
        }
        if (local_128._minY <= local_128._maxY) {
          uVar33 = iVar12 - uVar14;
          uVar23 = (ulong)uVar33;
          iVar19 = -1;
          iVar11 = local_128._minY;
          do {
            if (((int)uVar33 < 0) ||
               ((int)(local_328._barcodeMetadata._columnCount + 1U) < (int)uVar33)) {
LAB_00178d68:
              DetectionResultColumn::codewordNearby
                        ((Nullable<ZXing::Pdf417::Codeword> *)local_518,
                         &local_328._detectionResultColumns.
                          super__Vector_base<ZXing::Nullable<ZXing::Pdf417::DetectionResultColumn>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::DetectionResultColumn>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[iVar12].m_value,iVar11);
              uVar18 = local_518._0_8_ & 0xff;
              if ((local_518._0_8_ & 1) == 0) {
                if ((-1 < (int)uVar33) &&
                   ((int)uVar33 <= (int)(local_328._barcodeMetadata._columnCount + 1U))) {
                  DetectionResultColumn::codewordNearby
                            ((Nullable<ZXing::Pdf417::Codeword> *)local_518,
                             &local_328._detectionResultColumns.
                              super__Vector_base<ZXing::Nullable<ZXing::Pdf417::DetectionResultColumn>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::DetectionResultColumn>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar23].m_value,iVar11);
                  uVar18 = local_518._0_8_ & 0xff;
                }
                if ((uVar18 & 1) == 0) {
                  if ((int)uVar33 <= (int)(local_328._barcodeMetadata._columnCount + 1U) &&
                      -1 < (int)uVar33) {
                    iVar15 = 0;
                    uVar18 = uVar23;
                    do {
                      for (pNVar31 = local_328._detectionResultColumns.
                                     super__Vector_base<ZXing::Nullable<ZXing::Pdf417::DetectionResultColumn>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::DetectionResultColumn>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start[uVar18].m_value.
                                     _codewords.
                                     super__Vector_base<ZXing::Nullable<ZXing::Pdf417::Codeword>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::Codeword>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start;
                          pNVar31 !=
                          local_328._detectionResultColumns.
                          super__Vector_base<ZXing::Nullable<ZXing::Pdf417::DetectionResultColumn>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::DetectionResultColumn>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar18].m_value._codewords.
                          super__Vector_base<ZXing::Nullable<ZXing::Pdf417::Codeword>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::Codeword>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish; pNVar31 = pNVar31 + 1) {
                        if (pNVar31->m_hasValue == true) {
                          iVar15 = ((pNVar31->m_value)._endX - (pNVar31->m_value)._startX) *
                                   iVar15 * uVar14 + *(int *)(&pNVar31->m_hasValue + local_348);
                          goto LAB_00178ea1;
                        }
                      }
                      uVar24 = (int)uVar18 - uVar14;
                      uVar18 = (ulong)uVar24;
                    } while ((-1 < (int)uVar24) &&
                            (iVar15 = iVar15 + 1,
                            (int)uVar24 <= (int)(local_328._barcodeMetadata._columnCount + 1U)));
                  }
                  iVar15 = local_328._boundingBox.m_value._maxX;
                  if (bVar8 != false) {
                    iVar15 = local_328._boundingBox.m_value._minX;
                  }
                }
                else {
                  iVar15 = local_518._8_4_;
                  if (bVar8 == false) {
                    iVar15 = local_518._4_4_;
                  }
                }
              }
              else {
                iVar15 = local_518._8_4_;
                if (bVar8 != false) {
                  iVar15 = local_518._4_4_;
                }
              }
            }
            else {
              lVar16 = (long)iVar11 -
                       (long)local_328._detectionResultColumns.
                             super__Vector_base<ZXing::Nullable<ZXing::Pdf417::DetectionResultColumn>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::DetectionResultColumn>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[uVar23].m_value._boundingBox.
                             _minY;
              pNVar31 = local_328._detectionResultColumns.
                        super__Vector_base<ZXing::Nullable<ZXing::Pdf417::DetectionResultColumn>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::DetectionResultColumn>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar23].m_value._codewords.
                        super__Vector_base<ZXing::Nullable<ZXing::Pdf417::Codeword>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::Codeword>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              if ((pNVar31[lVar16].m_hasValue & 1U) == 0) goto LAB_00178d68;
              iVar15 = *(int *)((long)&pNVar31[lVar16].m_value._startX + local_428 * 4);
            }
LAB_00178ea1:
            if ((local_128._maxX < iVar15 || iVar15 < 0) && (iVar15 = iVar19, iVar19 == -1)) {
              iVar19 = -1;
            }
            else {
              DetectCodeword((Nullable<ZXing::Pdf417::Codeword> *)local_518,local_520,
                             local_128._minX,local_128._maxX,SUB81(local_428,0),iVar15,iVar11,
                             local_58c,maxCodewordWidth);
              pNVar22 = local_328._detectionResultColumns.
                        super__Vector_base<ZXing::Nullable<ZXing::Pdf417::DetectionResultColumn>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::DetectionResultColumn>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              if (local_518[0] == (allocator_type)0x1) {
                Nullable::operator_cast_to_Codeword((Codeword *)&local_280,(Nullable *)local_518);
                local_3f8._M_allocated_capacity._0_4_ = local_270;
                local_408 = (undefined1  [8])local_280;
                uStack_400 = dStack_278;
                lVar16 = (long)iVar11 - (long)pNVar22[iVar12].m_value._boundingBox._minY;
                pNVar31 = pNVar22[iVar12].m_value._codewords.
                          super__Vector_base<ZXing::Nullable<ZXing::Pdf417::Codeword>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::Codeword>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                pNVar31[lVar16].m_hasValue = true;
                pNVar31[lVar16].m_value._rowNumber = local_270;
                *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  **)&pNVar31[lVar16].m_value = local_280;
                *(double *)&pNVar31[lVar16].m_value._bucket = dStack_278;
                iVar10 = local_518._8_4_ - local_518._4_4_;
                if (iVar10 <= local_58c) {
                  local_58c = iVar10;
                }
                iVar19 = iVar15;
                if (maxCodewordWidth <= iVar10) {
                  maxCodewordWidth = iVar10;
                }
              }
            }
            bVar9 = iVar11 < local_128._maxY;
            iVar11 = iVar11 + 1;
          } while (bVar9);
        }
      }
      uVar23 = (ulong)((int)local_330 + 1);
    } while ((int)local_330 != (int)local_338);
  }
  std::
  vector<std::vector<ZXing::Pdf417::BarcodeValue,_std::allocator<ZXing::Pdf417::BarcodeValue>_>,_std::allocator<std::vector<ZXing::Pdf417::BarcodeValue,_std::allocator<ZXing::Pdf417::BarcodeValue>_>_>_>
  ::vector(&local_440,
           (long)local_328._barcodeMetadata._rowCountLowerPart +
           (long)local_328._barcodeMetadata._rowCountUpperPart,(allocator_type *)local_518);
  pvVar5 = local_440.
           super__Vector_base<std::vector<ZXing::Pdf417::BarcodeValue,_std::allocator<ZXing::Pdf417::BarcodeValue>_>,_std::allocator<std::vector<ZXing::Pdf417::BarcodeValue,_std::allocator<ZXing::Pdf417::BarcodeValue>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (this = local_440.
              super__Vector_base<std::vector<ZXing::Pdf417::BarcodeValue,_std::allocator<ZXing::Pdf417::BarcodeValue>_>,_std::allocator<std::vector<ZXing::Pdf417::BarcodeValue,_std::allocator<ZXing::Pdf417::BarcodeValue>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start; this != pvVar5; this = this + 1) {
    std::vector<ZXing::Pdf417::BarcodeValue,_std::allocator<ZXing::Pdf417::BarcodeValue>_>::resize
              (this,(long)local_328._barcodeMetadata._columnCount + 2);
  }
  pvVar13 = DetectionResult::allColumns(&local_328);
  pNVar22 = (pvVar13->
            super__Vector_base<ZXing::Nullable<ZXing::Pdf417::DetectionResultColumn>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::DetectionResultColumn>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pNVar2 = (pvVar13->
           super__Vector_base<ZXing::Nullable<ZXing::Pdf417::DetectionResultColumn>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::DetectionResultColumn>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pNVar22 != pNVar2) {
    lVar16 = 0;
    do {
      if (pNVar22->m_hasValue == true) {
        pNVar3 = (pNVar22->m_value)._codewords.
                 super__Vector_base<ZXing::Nullable<ZXing::Pdf417::Codeword>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::Codeword>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (pNVar31 = (pNVar22->m_value)._codewords.
                       super__Vector_base<ZXing::Nullable<ZXing::Pdf417::Codeword>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::Codeword>_>_>
                       ._M_impl.super__Vector_impl_data._M_start; pNVar31 != pNVar3;
            pNVar31 = (pointer)((long)pNVar31 + 0x18)) {
          if (pNVar31->m_hasValue == true) {
            iVar12 = ((Codeword *)((long)pNVar31 + 0x14))->_startX;
            if ((-1 < (long)iVar12) &&
               (iVar11 = (int)((ulong)((long)local_440.
                                             super__Vector_base<std::vector<ZXing::Pdf417::BarcodeValue,_std::allocator<ZXing::Pdf417::BarcodeValue>_>,_std::allocator<std::vector<ZXing::Pdf417::BarcodeValue,_std::allocator<ZXing::Pdf417::BarcodeValue>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)local_440.
                                            super__Vector_base<std::vector<ZXing::Pdf417::BarcodeValue,_std::allocator<ZXing::Pdf417::BarcodeValue>_>,_std::allocator<std::vector<ZXing::Pdf417::BarcodeValue,_std::allocator<ZXing::Pdf417::BarcodeValue>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start) >> 3),
               SBORROW4(iVar12,iVar11 * -0x55555555) != iVar12 + iVar11 * 0x55555555 < 0)) {
              BarcodeValue::setValue
                        ((((vector<ZXing::Pdf417::BarcodeValue,_std::allocator<ZXing::Pdf417::BarcodeValue>_>
                            *)((long)local_440.
                                     super__Vector_base<std::vector<ZXing::Pdf417::BarcodeValue,_std::allocator<ZXing::Pdf417::BarcodeValue>_>,_std::allocator<std::vector<ZXing::Pdf417::BarcodeValue,_std::allocator<ZXing::Pdf417::BarcodeValue>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start + (long)iVar12 * 0x18
                              ))->
                         super__Vector_base<ZXing::Pdf417::BarcodeValue,_std::allocator<ZXing::Pdf417::BarcodeValue>_>
                         )._M_impl.super__Vector_impl_data._M_start + lVar16,
                         ((Codeword *)((long)pNVar31 + 0x10))->_startX);
            }
          }
        }
      }
      lVar16 = lVar16 + 1;
      pNVar22 = pNVar22 + 1;
    } while (pNVar22 != pNVar2);
  }
  BarcodeValue::value((vector<int,_std::allocator<int>_> *)local_518,
                      ((local_440.
                        super__Vector_base<std::vector<ZXing::Pdf417::BarcodeValue,_std::allocator<ZXing::Pdf417::BarcodeValue>_>,_std::allocator<std::vector<ZXing::Pdf417::BarcodeValue,_std::allocator<ZXing::Pdf417::BarcodeValue>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->
                      super__Vector_base<ZXing::Pdf417::BarcodeValue,_std::allocator<ZXing::Pdf417::BarcodeValue>_>
                      )._M_impl.super__Vector_impl_data._M_start + 1);
  iVar11 = (local_328._barcodeMetadata._rowCountLowerPart +
           local_328._barcodeMetadata._rowCountUpperPart) * local_328._barcodeMetadata._columnCount;
  iVar19 = -2 << ((byte)local_328._barcodeMetadata._errorCorrectionLevel & 0x1f);
  iVar12 = 0;
  if (0xfffffc5f < (iVar19 + iVar11) - 0x3a1U) {
    iVar12 = iVar19 + iVar11;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_518._0_8_ == stack0xfffffffffffffaf0) {
    if (iVar12 == 0) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_518._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete((void *)local_518._0_8_,
                        CONCAT71(local_508._M_allocated_capacity._1_7_,local_508._M_local_buf[0]) -
                        local_518._0_8_);
      }
      memset(__return_storage_ptr__,0,0xd0);
      DecoderResult::DecoderResult(__return_storage_ptr__);
      goto LAB_0017982c;
    }
LAB_00179153:
    BarcodeValue::setValue
              (((local_440.
                 super__Vector_base<std::vector<ZXing::Pdf417::BarcodeValue,_std::allocator<ZXing::Pdf417::BarcodeValue>_>,_std::allocator<std::vector<ZXing::Pdf417::BarcodeValue,_std::allocator<ZXing::Pdf417::BarcodeValue>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->
               super__Vector_base<ZXing::Pdf417::BarcodeValue,_std::allocator<ZXing::Pdf417::BarcodeValue>_>
               )._M_impl.super__Vector_impl_data._M_start + 1,iVar12);
LAB_0017916f:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_518._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) goto LAB_00179174;
  }
  else {
    if (iVar12 == 0) goto LAB_0017916f;
    if (*(int *)local_518._0_8_ != iVar12) goto LAB_00179153;
LAB_00179174:
    operator_delete((void *)local_518._0_8_,
                    CONCAT71(local_508._M_allocated_capacity._1_7_,local_508._M_local_buf[0]) -
                    local_518._0_8_);
  }
  local_538 = (void *)0x0;
  iStack_530._M_current = (int *)0x0;
  local_528 = (int *)0x0;
  local_518._0_8_ = local_518._0_8_ & 0xffffffff00000000;
  std::vector<int,_std::allocator<int>_>::vector
            (&local_420,
             (long)local_328._barcodeMetadata._columnCount *
             ((long)local_328._barcodeMetadata._rowCountLowerPart +
             (long)local_328._barcodeMetadata._rowCountUpperPart),(value_type_conflict3 *)local_518,
             (allocator_type *)local_408);
  __n = 0;
  local_368.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_368.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_368.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_548 = (int *)0x0;
  local_558 = (void *)0x0;
  iStack_550._M_current = (int *)0x0;
  if (local_328._barcodeMetadata._rowCountLowerPart + local_328._barcodeMetadata._rowCountUpperPart
      != 0 && SCARRY4(local_328._barcodeMetadata._rowCountLowerPart,
                      local_328._barcodeMetadata._rowCountUpperPart) ==
              local_328._barcodeMetadata._rowCountLowerPart +
              local_328._barcodeMetadata._rowCountUpperPart < 0) {
    uVar23 = (ulong)(uint)local_328._barcodeMetadata._columnCount;
    lVar16 = 0;
    iVar12 = local_328._barcodeMetadata._rowCountUpperPart;
    iVar11 = local_328._barcodeMetadata._rowCountLowerPart;
    do {
      if (0 < (int)uVar23) {
        lVar17 = 0x30;
        lVar34 = 0;
        do {
          BarcodeValue::value((vector<int,_std::allocator<int>_> *)local_518,
                              (BarcodeValue *)
                              ((long)&((local_440.
                                        super__Vector_base<std::vector<ZXing::Pdf417::BarcodeValue,_std::allocator<ZXing::Pdf417::BarcodeValue>_>,_std::allocator<std::vector<ZXing::Pdf417::BarcodeValue,_std::allocator<ZXing::Pdf417::BarcodeValue>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start[lVar16].
                                        super__Vector_base<ZXing::Pdf417::BarcodeValue,_std::allocator<ZXing::Pdf417::BarcodeValue>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->_values)._M_t.
                                      _M_impl + lVar17));
          iVar12 = local_328._barcodeMetadata._columnCount * (int)lVar16 + (int)lVar34;
          local_408._0_4_ = iVar12;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_518._0_8_ == stack0xfffffffffffffaf0) {
            if (iStack_530._M_current == local_528) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        ((vector<int,std::allocator<int>> *)&local_538,iStack_530,(int *)local_408);
            }
            else {
              *iStack_530._M_current = iVar12;
              iStack_530._M_current = iStack_530._M_current + 1;
            }
          }
          else if ((long)stack0xfffffffffffffaf0 - local_518._0_8_ == 4) {
            local_420.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[iVar12] = *(int *)local_518._0_8_;
          }
          else {
            if (iStack_550._M_current == local_548) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        ((vector<int,std::allocator<int>> *)&local_558,iStack_550,(int *)local_408);
            }
            else {
              *iStack_550._M_current = iVar12;
              iStack_550._M_current = iStack_550._M_current + 1;
            }
            std::
            vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ::push_back(&local_368,(vector<int,_std::allocator<int>_> *)local_518);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_518._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            operator_delete((void *)local_518._0_8_,
                            CONCAT71(local_508._M_allocated_capacity._1_7_,local_508._M_local_buf[0]
                                    ) - local_518._0_8_);
          }
          lVar34 = lVar34 + 1;
          uVar23 = (ulong)local_328._barcodeMetadata._columnCount;
          lVar17 = lVar17 + 0x30;
          iVar12 = local_328._barcodeMetadata._rowCountUpperPart;
          iVar11 = local_328._barcodeMetadata._rowCountLowerPart;
        } while (lVar34 < (long)uVar23);
      }
      lVar16 = lVar16 + 1;
    } while (lVar16 < iVar12 + iVar11);
    __n = (long)iStack_550._M_current - (long)local_558 >> 2;
  }
  local_518._0_8_ = local_518._0_8_ & 0xffffffff00000000;
  std::vector<int,_std::allocator<int>_>::vector
            (&local_578,__n,(value_type_conflict3 *)local_518,(allocator_type *)local_408);
  iVar12 = 99;
  do {
    if ((long)local_578.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)local_578.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start != 0) {
      lVar16 = (long)local_578.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_578.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start >> 2;
      lVar17 = 0;
      pvVar20 = local_368.
                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        local_420.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[*(int *)((long)local_558 + lVar17 * 4)] =
             (pvVar20->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start
             [*(int *)((long)local_578.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start + lVar17 * 4)];
        lVar17 = lVar17 + 1;
        pvVar20 = pvVar20 + 1;
      } while (lVar16 + (ulong)(lVar16 == 0) != lVar17);
    }
    DecodeCodewords((DecoderResult *)local_518,(Pdf417 *)&local_420,
                    (vector<int,_std::allocator<int>_> *)
                    (ulong)(uint)(1 << ((byte)local_328._barcodeMetadata._errorCorrectionLevel + 1 &
                                       0x1f)),(int)local_538,
                    (vector<int,_std::allocator<int>_> *)iStack_530._M_current);
    uVar7 = local_3f8._M_allocated_capacity._4_4_;
    uVar6 = local_3f8._M_allocated_capacity._0_4_;
    if (local_45e != Checksum) {
      DecoderResult::DecoderResult(__return_storage_ptr__,(DecoderResult *)local_518);
LAB_001796de:
      if (local_450._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_450._M_pi);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_488._M_p != &local_478) {
        operator_delete(local_488._M_p,local_478._M_allocated_capacity + 1);
      }
      if (local_4b0._M_p != local_4a0) {
        operator_delete(local_4b0._M_p,(ulong)(local_4a0._0_8_ + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4e0._M_p != local_4d0) {
        operator_delete(local_4e0._M_p,local_4d0[0]._M_allocated_capacity + 1);
      }
      pvVar4 = (void *)CONCAT17(local_508._M_local_buf[0xf],
                                CONCAT25(local_508._13_2_,
                                         CONCAT41(local_508._9_4_,local_508._M_local_buf[8])));
      if (pvVar4 != (void *)0x0) {
        operator_delete(pvVar4,CONCAT53(uStack_4ed,CONCAT12(TStack_4ee,local_4f0)) - (long)pvVar4);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_518._0_8_ ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) goto LAB_00179789;
      uVar23 = CONCAT71(local_508._M_allocated_capacity._1_7_,local_508._M_local_buf[0]) -
               local_518._0_8_;
      auVar32 = (undefined1  [8])local_518._0_8_;
      goto LAB_00179784;
    }
    local_3f8._M_allocated_capacity._1_3_ = local_a8._topLeft._1_3_;
    local_3f8._M_allocated_capacity._4_4_ = local_a8._topLeft._4_4_;
    if (local_578.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start ==
        local_578.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      local_b0 = &local_a8._topLeft;
      local_408 = (undefined1  [8])&local_3f8;
      local_3f8._M_allocated_capacity._0_4_ =
           (uint)(uint3)local_3f8._M_allocated_capacity._1_3_ << 8;
      local_3f8._9_4_ = local_a8._topLeft.m_value.super_PointF.x._1_4_;
      local_3f8._13_2_ = local_a8._topLeft.m_value.super_PointF.x._5_2_;
      local_3f8._M_local_buf[0xf] = local_a8._topLeft.m_value.super_PointF.x._7_1_;
      uStack_400 = 0.0;
      local_a8._imgWidth = 0;
      local_a8._imgHeight = 0;
      local_a8._topLeft.m_hasValue = false;
      local_3e8 = "src/pdf417/PDFScanningDecoder.cpp";
      local_3e0 = 0x271;
      local_3de = Checksum;
      DecoderResult::DecoderResult(__return_storage_ptr__,(Error *)local_408);
LAB_001796a4:
      if (local_408 != (undefined1  [8])&local_3f8) {
        operator_delete((void *)local_408,
                        CONCAT44(local_3f8._M_allocated_capacity._4_4_,
                                 local_3f8._M_allocated_capacity._0_4_) + 1);
      }
      if (local_b0 != &local_a8._topLeft) {
        operator_delete(local_b0,CONCAT71(local_a8._topLeft._1_7_,local_a8._topLeft.m_hasValue) + 1)
        ;
      }
      goto LAB_001796de;
    }
    lVar16 = (long)local_578.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_578.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start >> 2;
    ppiVar21 = &((local_368.
                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->
                super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
                _M_finish;
    lVar17 = 0;
    do {
      iVar11 = *(int *)((long)local_578.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start + lVar17 * 4);
      if (iVar11 < (int)((ulong)((long)*ppiVar21 -
                                (long)((_Vector_impl_data *)(ppiVar21 + -1))->_M_start) >> 2) + -1)
      {
        *(int *)((long)local_578.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start + lVar17 * 4) = iVar11 + 1;
        break;
      }
      *(int *)((long)local_578.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start + lVar17 * 4) = 0;
      if (lVar16 + -1 == lVar17) {
        local_b0 = &local_a8._topLeft;
        local_408 = (undefined1  [8])&local_3f8;
        local_3f8._M_allocated_capacity._0_4_ =
             (uint)(uint3)local_3f8._M_allocated_capacity._1_3_ << 8;
        local_3f8._9_4_ = local_a8._topLeft.m_value.super_PointF.x._1_4_;
        local_3f8._13_2_ = local_a8._topLeft.m_value.super_PointF.x._5_2_;
        local_3f8._M_local_buf[0xf] = local_a8._topLeft.m_value.super_PointF.x._7_1_;
        uStack_400 = 0.0;
        local_a8._imgWidth = 0;
        local_a8._imgHeight = 0;
        local_a8._topLeft.m_hasValue = false;
        local_3e8 = "src/pdf417/PDFScanningDecoder.cpp";
        local_3e0 = 0x27b;
        local_3de = Checksum;
        DecoderResult::DecoderResult(__return_storage_ptr__,(Error *)local_408);
        goto LAB_001796a4;
      }
      lVar17 = lVar17 + 1;
      ppiVar21 = ppiVar21 + 3;
    } while (lVar16 + (ulong)(lVar16 == 0) != lVar17);
    local_3f8._M_allocated_capacity._0_4_ = uVar6;
    local_3f8._M_allocated_capacity._4_4_ = uVar7;
    if (local_450._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_450._M_pi);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_488._M_p != &local_478) {
      operator_delete(local_488._M_p,local_478._M_allocated_capacity + 1);
    }
    if (local_4b0._M_p != local_4a0) {
      operator_delete(local_4b0._M_p,(ulong)(local_4a0._0_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4e0._M_p != local_4d0) {
      operator_delete(local_4e0._M_p,local_4d0[0]._M_allocated_capacity + 1);
    }
    pvVar4 = (void *)CONCAT17(local_508._M_local_buf[0xf],
                              CONCAT25(local_508._13_2_,
                                       CONCAT41(local_508._9_4_,local_508._M_local_buf[8])));
    if (pvVar4 != (void *)0x0) {
      operator_delete(pvVar4,CONCAT53(uStack_4ed,CONCAT12(TStack_4ee,local_4f0)) - (long)pvVar4);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_518._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      operator_delete((void *)local_518._0_8_,
                      CONCAT71(local_508._M_allocated_capacity._1_7_,local_508._M_local_buf[0]) -
                      local_518._0_8_);
    }
    bVar8 = iVar12 != 0;
    iVar12 = iVar12 + -1;
  } while (bVar8);
  local_508._M_local_buf[0] = '\0';
  local_508._4_4_ = local_3f8._M_allocated_capacity._4_4_;
  local_508._M_allocated_capacity._1_3_ = local_3f8._M_allocated_capacity._1_3_;
  local_508._9_4_ = local_3f8._9_4_;
  local_508._13_2_ = local_3f8._13_2_;
  local_508._M_local_buf[0xf] = local_3f8._M_local_buf[0xf];
  stack0xfffffffffffffaf0 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)0x0;
  uStack_400 = 0.0;
  local_3f8._M_allocated_capacity._0_4_ = local_3f8._M_allocated_capacity._0_4_ & 0xffffff00;
  local_4f8 = (pointer)0x19aa40;
  local_4f0 = 0x280;
  TStack_4ee = Checksum;
  local_518._0_8_ = &local_508;
  local_408 = (undefined1  [8])&local_3f8;
  DecoderResult::DecoderResult(__return_storage_ptr__,(Error *)local_518);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_518._0_8_ != &local_508) {
    operator_delete((void *)local_518._0_8_,
                    CONCAT71(local_508._M_allocated_capacity._1_7_,local_508._M_local_buf[0]) + 1);
  }
  if (local_408 != (undefined1  [8])&local_3f8) {
    uVar23 = CONCAT44(local_3f8._M_allocated_capacity._4_4_,local_3f8._M_allocated_capacity._0_4_) +
             1;
    auVar32 = local_408;
LAB_00179784:
    operator_delete((void *)auVar32,uVar23);
  }
LAB_00179789:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_578.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete(local_578.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_578.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_578.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_558 != (void *)0x0) {
    operator_delete(local_558,(long)local_548 - (long)local_558);
  }
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&local_368);
  if (local_420.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_420.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_420.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_420.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_538 != (void *)0x0) {
    operator_delete(local_538,(long)local_528 - (long)local_538);
  }
LAB_0017982c:
  std::
  vector<std::vector<ZXing::Pdf417::BarcodeValue,_std::allocator<ZXing::Pdf417::BarcodeValue>_>,_std::allocator<std::vector<ZXing::Pdf417::BarcodeValue,_std::allocator<ZXing::Pdf417::BarcodeValue>_>_>_>
  ::~vector(&local_440);
LAB_00179839:
  std::
  vector<ZXing::Nullable<ZXing::Pdf417::DetectionResultColumn>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::DetectionResultColumn>_>_>
  ::~vector(&local_328._detectionResultColumns);
  if (local_1c8.m_value._codewords.
      super__Vector_base<ZXing::Nullable<ZXing::Pdf417::Codeword>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::Codeword>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1c8.m_value._codewords.
                    super__Vector_base<ZXing::Nullable<ZXing::Pdf417::Codeword>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::Codeword>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    CONCAT44(local_1c8.m_value._codewords.
                             super__Vector_base<ZXing::Nullable<ZXing::Pdf417::Codeword>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::Codeword>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                             local_1c8.m_value._codewords.
                             super__Vector_base<ZXing::Nullable<ZXing::Pdf417::Codeword>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::Codeword>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_) -
                    (long)local_1c8.m_value._codewords.
                          super__Vector_base<ZXing::Nullable<ZXing::Pdf417::Codeword>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::Codeword>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_268.m_value._codewords.
      super__Vector_base<ZXing::Nullable<ZXing::Pdf417::Codeword>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::Codeword>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_268.m_value._codewords.
                    super__Vector_base<ZXing::Nullable<ZXing::Pdf417::Codeword>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::Codeword>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    CONCAT44(local_268.m_value._codewords.
                             super__Vector_base<ZXing::Nullable<ZXing::Pdf417::Codeword>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::Codeword>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                             local_268.m_value._codewords.
                             super__Vector_base<ZXing::Nullable<ZXing::Pdf417::Codeword>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::Codeword>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_) -
                    (long)local_268.m_value._codewords.
                          super__Vector_base<ZXing::Nullable<ZXing::Pdf417::Codeword>,_std::allocator<ZXing::Nullable<ZXing::Pdf417::Codeword>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

DecoderResult
ScanningDecoder::Decode(const BitMatrix& image, const Nullable<ResultPoint>& imageTopLeft, const Nullable<ResultPoint>& imageBottomLeft,
	const Nullable<ResultPoint>& imageTopRight, const Nullable<ResultPoint>& imageBottomRight,
	int minCodewordWidth, int maxCodewordWidth)
{
	BoundingBox boundingBox;
	if (!BoundingBox::Create(image.width(), image.height(), imageTopLeft, imageBottomLeft, imageTopRight, imageBottomRight, boundingBox)) {
		return {};
	}
	
	Nullable<DetectionResultColumn> leftRowIndicatorColumn, rightRowIndicatorColumn;
	DetectionResult detectionResult;
	for (int i = 0; i < 2; i++) {
		if (imageTopLeft != nullptr) {
			leftRowIndicatorColumn = GetRowIndicatorColumn(image, boundingBox, imageTopLeft, true, minCodewordWidth, maxCodewordWidth);
		}
		if (imageTopRight != nullptr) {
			rightRowIndicatorColumn = GetRowIndicatorColumn(image, boundingBox, imageTopRight, false, minCodewordWidth, maxCodewordWidth);
		}
		if (!Merge(leftRowIndicatorColumn, rightRowIndicatorColumn, detectionResult)) {
			return {};
		}
		if (i == 0 && detectionResult.getBoundingBox() != nullptr && (detectionResult.getBoundingBox().value().minY() < boundingBox.minY() || detectionResult.getBoundingBox().value().maxY() > boundingBox.maxY())) {
			boundingBox = detectionResult.getBoundingBox();
		}
		else {
			detectionResult.setBoundingBox(boundingBox);
			break;
		}
	}

	int maxBarcodeColumn = detectionResult.barcodeColumnCount() + 1;
	detectionResult.setColumn(0, leftRowIndicatorColumn);
	detectionResult.setColumn(maxBarcodeColumn, rightRowIndicatorColumn);

	bool leftToRight = leftRowIndicatorColumn != nullptr;
	for (int barcodeColumnCount = 1; barcodeColumnCount <= maxBarcodeColumn; barcodeColumnCount++) {
		int barcodeColumn = leftToRight ? barcodeColumnCount : maxBarcodeColumn - barcodeColumnCount;
		if (detectionResult.column(barcodeColumn) != nullptr) {
			// This will be the case for the opposite row indicator column, which doesn't need to be decoded again.
			continue;
		}
		DetectionResultColumn::RowIndicator rowIndicator = barcodeColumn == 0 ? DetectionResultColumn::RowIndicator::Left : (barcodeColumn == maxBarcodeColumn ? DetectionResultColumn::RowIndicator::Right : DetectionResultColumn::RowIndicator::None);
		detectionResult.setColumn(barcodeColumn, DetectionResultColumn(boundingBox, rowIndicator));
		int startColumn = -1;
		int previousStartColumn = startColumn;
		// TODO start at a row for which we know the start position, then detect upwards and downwards from there.
		for (int imageRow = boundingBox.minY(); imageRow <= boundingBox.maxY(); imageRow++) {
			startColumn = GetStartColumn(detectionResult, barcodeColumn, imageRow, leftToRight);
			if (startColumn < 0 || startColumn > boundingBox.maxX()) {
				if (previousStartColumn == -1) {
					continue;
				}
				startColumn = previousStartColumn;
			}
			Nullable<Codeword> codeword = DetectCodeword(image, boundingBox.minX(), boundingBox.maxX(), leftToRight, startColumn, imageRow, minCodewordWidth, maxCodewordWidth);
			if (codeword != nullptr) {
				detectionResult.column(barcodeColumn).value().setCodeword(imageRow, codeword);
				previousStartColumn = startColumn;
				UpdateMinMax(minCodewordWidth, maxCodewordWidth, codeword.value().width());
			}
		}
	}
	return CreateDecoderResult(detectionResult);
}